

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignalsImpl::Register
          (ValidationSignalsImpl *this,shared_ptr<CValidationInterface> callbacks)

{
  long lVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false,_false>,_bool>
  pVar3;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock1,&this->m_mutex,"m_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
             ,0x34,false);
  pVar3 = std::
          _Hashtable<CValidationInterface*,std::pair<CValidationInterface*const,std::_List_iterator<ValidationSignalsImpl::ListEntry>>,std::allocator<std::pair<CValidationInterface*const,std::_List_iterator<ValidationSignalsImpl::ListEntry>>>,std::__detail::_Select1st,std::equal_to<CValidationInterface*>,std::hash<CValidationInterface*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<CValidationInterface*,std::_List_iterator<ValidationSignalsImpl::ListEntry>>
                    ((_Hashtable<CValidationInterface*,std::pair<CValidationInterface*const,std::_List_iterator<ValidationSignalsImpl::ListEntry>>,std::allocator<std::pair<CValidationInterface*const,std::_List_iterator<ValidationSignalsImpl::ListEntry>>>,std::__detail::_Select1st,std::equal_to<CValidationInterface*>,std::hash<CValidationInterface*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->m_map);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    iVar2._M_node =
         *(_List_node_base **)
          ((long)pVar3.first.
                 super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
                 ._M_cur.
                 super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
          + 0x10);
  }
  else {
    iVar2 = std::__cxx11::
            list<ValidationSignalsImpl::ListEntry,_std::allocator<ValidationSignalsImpl::ListEntry>_>
            ::emplace<>(&this->m_list,(const_iterator)&this->m_list);
    *(_List_node_base **)
     ((long)pVar3.first.
            super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
            ._M_cur.
            super__Node_iterator_base<std::pair<CValidationInterface_*const,_std::_List_iterator<ValidationSignalsImpl::ListEntry>_>,_false>
     + 0x10) = iVar2._M_node;
  }
  std::__shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2> *)(iVar2._M_node + 1),
             (__shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2> *)
             callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        LOCK(m_mutex);
        auto inserted = m_map.emplace(callbacks.get(), m_list.end());
        if (inserted.second) inserted.first->second = m_list.emplace(m_list.end());
        inserted.first->second->callbacks = std::move(callbacks);
    }